

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O2

vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> * __thiscall
msc::
cluster_shifted<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq>
          (double param_1,
          vector<msc::Cluster<double>,std::allocator<msc::Cluster<double>>> *__return_storage_ptr__,
          msc *this,msc *first,int param_5)

{
  ulong uVar1;
  invalid_argument *this_00;
  long lVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  double dVar5;
  L2Sq local_55;
  int dim_local;
  double *pt;
  unsigned_long local_48;
  msc *local_40;
  double local_38;
  
  dim_local = param_5;
  local_40 = first;
  local_38 = param_1;
  if (param_5 < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  *(undefined8 *)(__return_storage_ptr__ + 0x10) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)(__return_storage_ptr__ + 8) = 0;
  local_48 = 0;
  do {
    if (this == local_40) {
      return (vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
             __return_storage_ptr__;
    }
    pt = *(double **)this;
    lVar3 = 0x18;
    uVar4 = 0;
    while( true ) {
      lVar2 = *(long *)__return_storage_ptr__;
      uVar1 = (*(long *)(__return_storage_ptr__ + 8) - lVar2) / 0x30;
      if (uVar1 <= uVar4) break;
      dVar5 = metrics::L2Sq::operator()(&local_55,pt,*(double **)(lVar2 + -0x18 + lVar3),dim_local);
      if (dVar5 <= local_38) {
        lVar2 = *(long *)__return_storage_ptr__;
        uVar1 = (*(long *)(__return_storage_ptr__ + 8) - lVar2) / 0x30;
        break;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x30;
    }
    if (uVar1 == uVar4) {
      std::vector<msc::Cluster<double>,std::allocator<msc::Cluster<double>>>::
      emplace_back<double_const*&,int&>(__return_storage_ptr__,&pt,&dim_local);
      lVar2 = *(long *)__return_storage_ptr__;
    }
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)(lVar2 + lVar3),&local_48);
    this = this + 0x18;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

inline std::vector<Cluster<T>> cluster_shifted(
    InputIterator first, InputIterator last, int dim, Metric metric,
    double epsilon = std::numeric_limits<float>::epsilon())
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<InputIterator>::value_type C;
    std::vector<Cluster<T>> clusters;
    std::size_t i = 0;
    for (auto it = first; it != last; it++, i++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        std::size_t c = 0;
        for (; c < clusters.size(); c++)
            if (metric(pt, clusters[c].mode.data(), dim) <= epsilon)
                break;
        if (c == clusters.size())
            clusters.emplace_back(pt, dim);
        clusters[c].members.emplace_back(i);
    }

    return clusters;
}